

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::readPacket(MatroskaDemuxer *this,AVPacket *avPacket)

{
  int *levelUp;
  int iVar1;
  uint32_t uVar2;
  undefined8 *puVar3;
  long lVar4;
  AVPacket *pAVar5;
  byte bVar6;
  AVPacket *newPacket;
  uint32_t local_34;
  
  bVar6 = 0;
  pAVar5 = this->m_lastDeliveryPacket;
  if (pAVar5 != (AVPacket *)0x0) {
    if (pAVar5->data != (uint8_t *)0x0) {
      operator_delete__(pAVar5->data);
      pAVar5 = this->m_lastDeliveryPacket;
    }
    operator_delete(pAVar5,0x50);
    this->m_lastDeliveryPacket = (AVPacket *)0x0;
  }
  newPacket = (AVPacket *)0x0;
  levelUp = &this->level_up;
LAB_001ad15e:
  do {
    iVar1 = matroska_deliver_packet(this,&newPacket);
    pAVar5 = newPacket;
    if (iVar1 == 0) {
      if (newPacket == (AVPacket *)0x0) {
        puVar3 = (undefined8 *)operator_new(0x50);
        *(undefined4 *)(puVar3 + 4) = 0;
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3[2] = 0;
        puVar3[3] = 0;
        puVar3[5] = 0;
        puVar3[6] = 0;
        puVar3[7] = 0;
        puVar3[8] = 0;
        *(undefined4 *)(puVar3 + 9) = 0;
        for (lVar4 = 0x4c; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined1 *)&avPacket->pts = *(undefined1 *)puVar3;
          puVar3 = (undefined8 *)((long)puVar3 + (ulong)bVar6 * -2 + 1);
          avPacket = (AVPacket *)((long)avPacket + (ulong)bVar6 * -2 + 1);
        }
      }
      else {
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          avPacket->pts = newPacket->pts;
          newPacket = (AVPacket *)((long)newPacket + (ulong)bVar6 * -0x10 + 8);
          avPacket = (AVPacket *)((long)avPacket + (ulong)bVar6 * -0x10 + 8);
        }
      }
      this->m_lastDeliveryPacket = pAVar5;
      return 0;
    }
    if (this->done != false) {
      return 1;
    }
    iVar1 = 0;
    do {
      if (iVar1 != 0) goto LAB_001ad1e8;
      uVar2 = ebml_peek_id(this,levelUp);
      if (uVar2 == 0) {
        return 1;
      }
      if (*levelUp != 0) {
        *levelUp = *levelUp + -1;
        goto LAB_001ad15e;
      }
      if (uVar2 == 0x1a45dfa3) {
        matroska_read_header(this);
        iVar1 = 0;
      }
      else if (uVar2 == 0x1f43b675) {
        iVar1 = ebml_read_master(this,&local_34);
        if (-1 < iVar1) {
          iVar1 = matroska_parse_cluster(this);
          iVar1 = iVar1 + (uint)(iVar1 == 0);
        }
      }
      else {
        iVar1 = ebml_read_skip(this);
      }
    } while (*levelUp == 0);
    *levelUp = *levelUp + -1;
LAB_001ad1e8:
    if (iVar1 == -1) {
      this->done = true;
    }
  } while( true );
}

Assistant:

int MatroskaDemuxer::readPacket(AVPacket &avPacket)
{
    uint32_t id;
    if (m_lastDeliveryPacket)
    {
        delete[] m_lastDeliveryPacket->data;
        delete m_lastDeliveryPacket;
        m_lastDeliveryPacket = nullptr;
    }

    // Read stream until we have a packet queued.
    AVPacket *newPacket = nullptr;
    while (matroska_deliver_packet(newPacket) != 0)
    {
        // Have we already reached the end?
        if (done)
            return BufferedReader::DATA_EOF;

        int res = 0;
        while (res == 0)
        {
            if ((id = ebml_peek_id(&level_up)) == 0)
            {
                return BufferedReader::DATA_EOF;
            }
            if (level_up)
            {
                level_up--;
                break;
            }

            switch (id)
            {
            case MATROSKA_ID_CLUSTER:
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                if ((res = matroska_parse_cluster()) == 0)
                    res = 1;  // Parsed one cluster, let's get out.
                break;
            case EBML_ID_HEADER:
                matroska_read_header();
                break;
            default:
                res = ebml_read_skip();
            }

            if (level_up)
            {
                level_up--;
                break;
            }
        }

        if (res == -1)
            done = true;
    }
    if (newPacket)
    {
        memcpy(&avPacket, newPacket, sizeof(AVPacket));
    }
    else
        avPacket = *new AVPacket();
    m_lastDeliveryPacket = newPacket;
    return 0;
}